

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tspm.hpp
# Opt level: O2

int __thiscall pg::TSPMSolver::todo_pop(TSPMSolver *this)

{
  int iVar1;
  ostream *poVar2;
  
  iVar1 = *(this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_start._M_cur;
  std::deque<int,_std::allocator<int>_>::pop_front(&this->todo);
  this->dirty[iVar1] = 0;
  if (1 < (this->super_Solver).trace) {
    poVar2 = std::operator<<((this->super_Solver).logger,"pop() => ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return iVar1;
}

Assistant:

int todo_pop() {
        int node = todo.front();
        todo.pop_front();
        dirty[node] = 0;
        if (trace >= 2) logger << "pop() => " << node << std::endl;
        return node;
    }